

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLHISTOGRAMPROC epoxy_glHistogram_resolver(void)

{
  PFNGLHISTOGRAMPROC p_Var1;
  
  p_Var1 = (PFNGLHISTOGRAMPROC)
           gl_provider_resolver
                     ("glHistogram",epoxy_glHistogram_resolver::providers,
                      epoxy_glHistogram_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLHISTOGRAMPROC
epoxy_glHistogram_resolver(void)
{
    static const enum gl_provider providers[] = {
        GL_extension_GL_ARB_imaging,
        GL_extension_GL_EXT_histogram,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        27983 /* "glHistogram" */,
        27995 /* "glHistogramEXT" */,
    };
    return gl_provider_resolver(entrypoint_strings + 27983 /* "glHistogram" */,
                                providers, entrypoints);
}